

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.cpp
# Opt level: O2

ostream * arangodb::velocypack::operator<<(ostream *stream,Slice *slice)

{
  ostream *poVar1;
  char *pcVar2;
  string local_40;
  
  poVar1 = std::operator<<(stream,"[Slice ");
  pcVar2 = valueTypeName(SliceStaticData::TypeMap[*slice->_start]);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1," (");
  SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::hexType_abi_cxx11_
            (&local_40,(SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)slice);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,"), byteSize: ");
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)slice);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string((string *)&local_40);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, Slice const* slice) {
  stream << "[Slice " << valueTypeName(slice->type()) << " ("
         << slice->hexType() << "), byteSize: " << slice->byteSize() << "]";
  return stream;
}